

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsStorage.cpp
# Opt level: O0

string * __thiscall
vkt::sparse::SparseCaseOpImageSparseFetch::sparseImageOpString
          (string *__return_storage_ptr__,SparseCaseOpImageSparseFetch *this,string *resultVariable,
          string *resultType,string *image,string *coord,string *mipLevel)

{
  ostream *poVar1;
  ostringstream local_1b0 [8];
  ostringstream src;
  string *coord_local;
  string *image_local;
  string *resultType_local;
  string *resultVariable_local;
  SparseCaseOpImageSparseFetch *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  poVar1 = std::operator<<((ostream *)local_1b0,(string *)resultVariable);
  poVar1 = std::operator<<(poVar1," = OpImageSparseFetch ");
  poVar1 = std::operator<<(poVar1,(string *)resultType);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)image);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)coord);
  poVar1 = std::operator<<(poVar1," Lod ");
  poVar1 = std::operator<<(poVar1,(string *)mipLevel);
  std::operator<<(poVar1,"\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string	SparseCaseOpImageSparseFetch::sparseImageOpString  (const std::string& resultVariable,
																const std::string& resultType,
																const std::string& image,
																const std::string& coord,
																const std::string& mipLevel) const
{
	std::ostringstream	src;

	src << resultVariable << " = OpImageSparseFetch " << resultType << " " << image << " " << coord << " Lod " << mipLevel << "\n";

	return src.str();
}